

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Iterator * __thiscall
leveldb::DBImpl::NewInternalIterator
          (DBImpl *this,ReadOptions *options,SequenceNumber *latest_snapshot,uint32_t *seed)

{
  MemTable *mem;
  MemTable *imm;
  uint64_t uVar1;
  Version *pVVar2;
  reference children;
  size_type sVar3;
  Iterator *this_00;
  IterState *this_01;
  uint32_t uVar4;
  IterState *cleanup;
  Iterator *internal_iter;
  Iterator *local_48;
  undefined1 local_40 [8];
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> list;
  uint32_t *seed_local;
  SequenceNumber *latest_snapshot_local;
  ReadOptions *options_local;
  DBImpl *this_local;
  
  list.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)seed;
  port::Mutex::Lock(&this->mutex_);
  uVar1 = VersionSet::LastSequence(this->versions_);
  *latest_snapshot = uVar1;
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::vector
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)local_40);
  local_48 = MemTable::NewIterator(this->mem_);
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::push_back
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)local_40,&local_48
            );
  MemTable::Ref(this->mem_);
  if (this->imm_ != (MemTable *)0x0) {
    internal_iter = MemTable::NewIterator(this->imm_);
    std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::push_back
              ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)local_40,
               &internal_iter);
    MemTable::Ref(this->imm_);
  }
  pVVar2 = VersionSet::current(this->versions_);
  Version::AddIterators
            (pVVar2,options,
             (vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)local_40);
  children = std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::operator[]
                       ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)
                        local_40,0);
  sVar3 = std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::size
                    ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)local_40);
  this_00 = NewMergingIterator(&(this->internal_comparator_).super_Comparator,children,(int)sVar3);
  pVVar2 = VersionSet::current(this->versions_);
  Version::Ref(pVVar2);
  this_01 = (IterState *)operator_new(0x20);
  mem = this->mem_;
  imm = this->imm_;
  pVVar2 = VersionSet::current(this->versions_);
  anon_unknown_36::IterState::IterState(this_01,&this->mutex_,mem,imm,pVVar2);
  Iterator::RegisterCleanup(this_00,anon_unknown_36::CleanupIteratorState,this_01,(void *)0x0);
  uVar4 = this->seed_ + 1;
  this->seed_ = uVar4;
  *(uint32_t *)
   list.super__Vector_base<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage = uVar4;
  port::Mutex::Unlock(&this->mutex_);
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::~vector
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)local_40);
  return this_00;
}

Assistant:

Iterator* DBImpl::NewInternalIterator(const ReadOptions& options,
                                      SequenceNumber* latest_snapshot,
                                      uint32_t* seed) {
  mutex_.Lock();
  *latest_snapshot = versions_->LastSequence();

  // Collect together all needed child iterators
  std::vector<Iterator*> list;
  list.push_back(mem_->NewIterator());
  mem_->Ref();
  if (imm_ != nullptr) {
    list.push_back(imm_->NewIterator());
    imm_->Ref();
  }
  versions_->current()->AddIterators(options, &list);
  Iterator* internal_iter =
      NewMergingIterator(&internal_comparator_, &list[0], list.size());
  versions_->current()->Ref();

  IterState* cleanup = new IterState(&mutex_, mem_, imm_, versions_->current());
  internal_iter->RegisterCleanup(CleanupIteratorState, cleanup, nullptr);

  *seed = ++seed_;
  mutex_.Unlock();
  return internal_iter;
}